

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

void __thiscall
tlx::CmdlineParser::ArgumentStringlist::print_value(ArgumentStringlist *this,ostream *os)

{
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  ulong local_20;
  size_t i;
  ostream *os_local;
  ArgumentStringlist *this_local;
  
  std::operator<<(os,'[');
  local_20 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(this->dest_);
    if (sVar1 <= local_20) break;
    if (local_20 != 0) {
      std::operator<<(os,',');
    }
    poVar2 = std::operator<<(os,'\"');
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](this->dest_,local_20);
    poVar2 = std::operator<<(poVar2,(string *)pvVar3);
    std::operator<<(poVar2,'\"');
    local_20 = local_20 + 1;
  }
  std::operator<<(os,']');
  return;
}

Assistant:

void print_value(std::ostream& os) const final {
        os << '[';
        for (size_t i = 0; i < dest_.size(); ++i) {
            if (i != 0)
                os << ',';
            os << '"' << dest_[i] << '"';
        }
        os << ']';
    }